

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O1

void Memory::InPlaceFreeListPolicy::MergeDelayFreeList(void *freeList)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  FreeObject *firstFreeObject;
  long lVar4;
  long *__s;
  
  if (freeList != (void *)0x0) {
    lVar4 = 0;
    do {
      lVar1 = lVar4 + 1;
      plVar2 = *(long **)((long)freeList + lVar4 * 8 + 0x200);
      if (plVar2 == (long *)0x0) {
        __s = (long *)0x0;
      }
      else {
        do {
          __s = plVar2;
          plVar2 = (long *)*__s;
          memset(__s,0xfe,lVar1 * 0x10);
          *__s = (long)plVar2;
        } while (plVar2 != (long *)0x0);
      }
      lVar3 = *(long *)((long)freeList + lVar4 * 8);
      if (lVar3 == 0) {
        *(undefined8 *)((long)freeList + lVar4 * 8) =
             *(undefined8 *)((long)freeList + lVar4 * 8 + 0x200);
LAB_001f78ff:
        *(undefined8 *)((long)freeList + lVar4 * 8 + 0x200) = 0;
      }
      else if (__s != (long *)0x0) {
        *(undefined8 *)((long)freeList + lVar4 * 8) =
             *(undefined8 *)((long)freeList + lVar4 * 8 + 0x200);
        *__s = lVar3;
        goto LAB_001f78ff;
      }
      lVar4 = lVar1;
    } while (lVar1 != 0x40);
  }
  return;
}

Assistant:

void InPlaceFreeListPolicy::MergeDelayFreeList(void * freeList)
{
    if (!freeList) return;

    FreeObject ** freeObjectLists = reinterpret_cast<FreeObject **>(freeList);
    FreeObject ** delayFreeObjectLists = freeObjectLists + buckets;

    for (int i = 0; i < buckets; i++)
    {
        int size = (i + 1) << ArenaAllocator::ObjectAlignmentBitShift;
        FreeObject *delayObject = delayFreeObjectLists[i];
        FreeObject *lastDelayObject = nullptr;

        while (delayObject != nullptr)
        {
            FreeObject *nextDelayObject = delayObject->next;
            // DebugPatternFill is required here, because we set isDeleted bit on freed Opnd
            PrepareFreeObject(delayObject, size);
            delayObject->next = nextDelayObject;
            lastDelayObject = delayObject;
            delayObject = nextDelayObject;
        }

        if (freeObjectLists[i] == nullptr)
        {
            freeObjectLists[i] = delayFreeObjectLists[i];
            delayFreeObjectLists[i] = nullptr;
        }
        else if (lastDelayObject != nullptr) {
            FreeObject * firstFreeObject = freeObjectLists[i];
            freeObjectLists[i] = delayFreeObjectLists[i];
            lastDelayObject->next = firstFreeObject;
            delayFreeObjectLists[i] = nullptr;
        }
    }
}